

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_write_gather.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  int rank;
  int val_of_one;
  int val_of_three;
  int val_of_two;
  kvtree *send;
  kvtree *recv;
  int ranks;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  int local_20;
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  
  MPI_Init(local_1c,local_18);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_40);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_20);
  if (local_20 != 3) {
    printf("test_kvtree_write_gather, tests require 3 processes; actual # is %d\n");
    return 1;
  }
  lVar2 = kvtree_new();
  local_30 = lVar2;
  lVar3 = kvtree_new();
  local_28 = lVar3;
  if (local_40 == 0) {
    kvtree_util_set_int(lVar2,"ONE",1);
    kvtree_util_set_int(lVar2,"TWO",2);
  }
  if (local_40 == 2) {
    kvtree_util_set_int(lVar2,"ONE",0xffffffff);
    kvtree_util_set_int(lVar2,"THREE",3);
  }
  iVar1 = kvtree_write_gather("PREFIX",lVar2,&ompi_mpi_comm_world);
  if (iVar1 == 0) {
    iVar1 = kvtree_read_scatter("PREFIX",lVar3,&ompi_mpi_comm_world);
    if (iVar1 == 0) {
      if (lVar3 == 0) {
        printf("test_kvtree_write_gather, kvtree_read_scatter operation returned NULL kvtree");
        uVar4 = 0x31;
      }
      else {
        printf("rank=%d, send\n",(ulong)local_40);
        kvtree_print(lVar2,4);
        printf("rank=%d, recv\n",(ulong)local_40);
        kvtree_print(lVar3,4);
        if (local_40 == 0) {
          iVar1 = kvtree_util_get_int(lVar3,"ONE",&local_3c);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'ONE\' failed");
            uVar4 = 0x3c;
            goto LAB_0010135e;
          }
          if (local_3c != 1) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'ONE\' returned wrong value");
            uVar4 = 0x41;
            goto LAB_0010135e;
          }
          iVar1 = kvtree_util_get_int(lVar3,"TWO",&local_34);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'TWO\' failed");
            uVar4 = 0x47;
            goto LAB_0010135e;
          }
          if (local_34 != 2) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'TWO\' returned wrong value");
            uVar4 = 0x4c;
            goto LAB_0010135e;
          }
        }
        if (local_40 == 2) {
          iVar1 = kvtree_util_get_int(lVar3,"ONE",&local_3c);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'ONE\' failed");
            uVar4 = 0x54;
            goto LAB_0010135e;
          }
          if (local_3c != -1) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'ONE\' returned wrong value");
            uVar4 = 0x59;
            goto LAB_0010135e;
          }
          iVar1 = kvtree_util_get_int(lVar3,"THREE",&local_38);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'THREE\' failed");
            uVar4 = 0x5f;
            goto LAB_0010135e;
          }
          if (local_38 != 3) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'THREE\' returned wrong value");
            uVar4 = 100;
            goto LAB_0010135e;
          }
        }
        if ((local_40 == 1) && (iVar1 = kvtree_size(lVar3), iVar1 != 0)) {
          printf(
                "test_kvtree_write_gather, rank=1, sending hash of size 0 resulted in non-zero receive"
                );
          uVar4 = 0x6b;
        }
        else {
          kvtree_delete(&local_30);
          if (local_30 == 0) {
            kvtree_delete(&local_28);
            if (local_28 == 0) {
              MPI_Finalize();
              return 0;
            }
            printf("deletion of recv failed");
            uVar4 = 0x78;
          }
          else {
            printf("test_kvtree_write_gather, deletion of kvtree failed");
            uVar4 = 0x72;
          }
        }
      }
    }
    else {
      printf("test_kvtree_write_gather, kvtree_read_scatter operation failed");
      uVar4 = 0x2c;
    }
  }
  else {
    printf("test_kvtree_write_gather, kvtree_write_gather operation failed");
    uVar4 = 0x26;
  }
LAB_0010135e:
  printf("Error in line %d, file %s, function %s.\n",uVar4,
         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
         ,"main");
  return 1;
}

Assistant:

int main(int argc, char** argv){
  kvtree* recv;
  kvtree* send;
  //int rc = TEST_PASS;
  int rank, ranks, kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);
  if( ranks != 3){
    printf("test_kvtree_write_gather, tests require 3 processes; actual # is %d\n", ranks);
    return TEST_FAIL;
  }

  send = kvtree_new();
  recv = kvtree_new();
  if(rank == 0){
    kvtree_util_set_int(send, "ONE", 1);
    kvtree_util_set_int(send, "TWO", 2);
  }
  if(rank == 2){
    kvtree_util_set_int(send, "ONE", -1);
    kvtree_util_set_int(send, "THREE", 3);
  }

  kvtree_rc = kvtree_write_gather("PREFIX", send, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf("test_kvtree_write_gather, kvtree_write_gather operation failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  kvtree_rc = kvtree_read_scatter("PREFIX", recv, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf("test_kvtree_write_gather, kvtree_read_scatter operation failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if (recv == NULL){
    printf("test_kvtree_write_gather, kvtree_read_scatter operation returned NULL kvtree");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  printf("rank=%d, send\n", rank);
  kvtree_print(send, 4);
  printf("rank=%d, recv\n", rank);
  kvtree_print(recv, 4);
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=0, recv read of 'ONE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_one != 1){
      printf("test_kvtree_write_gather, rank=0, recv read of 'ONE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=0, recv read of 'TWO' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_two != 2){
      printf("test_kvtree_write_gather, rank=0, recv read of 'TWO' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=2, recv read of 'ONE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_one != -1){
      printf("test_kvtree_write_gather, rank=2, recv read of 'ONE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=2, recv read of 'THREE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_three != 3){
      printf("test_kvtree_write_gather, rank=2, recv read of 'THREE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  if(rank ==1){
    if(kvtree_size(recv) != 0){
      printf("test_kvtree_write_gather, rank=1, sending hash of size 0 resulted in non-zero receive");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_write_gather, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }

  MPI_Finalize();
  return TEST_PASS;
}